

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O2

Image * __thiscall
anon_unknown.dwarf_a4e46::ImageManager::operator()(ImageManager *this,Image *image)

{
  pointer *pppRVar1;
  pointer __src;
  ReferenceOwner *pRVar2;
  ulong uVar3;
  pointer ppRVar4;
  int in_ECX;
  size_t __n;
  void *in_R8;
  ulong uVar5;
  ulong uVar6;
  
  if (image->_type != this->_type) {
    pRVar2 = (ReferenceOwner *)operator_new(8);
    pRVar2->data = image;
    ppRVar4 = (this->_output).
              super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppRVar4 ==
        (this->_output).
        super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __src = (this->_output).
              super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)ppRVar4 - (long)__src;
      if (__n == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar5 = (long)__n >> 3;
      uVar3 = 1;
      if (ppRVar4 != __src) {
        uVar3 = uVar5;
      }
      in_ECX = -1;
      uVar6 = uVar3 + uVar5;
      if (0xffffffffffffffe < uVar6) {
        uVar6 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar3,uVar5)) {
        uVar6 = 0xfffffffffffffff;
      }
      if (uVar6 == 0) {
        ppRVar4 = (pointer)0x0;
      }
      else {
        in_ECX = -1;
        ppRVar4 = (pointer)operator_new(uVar6 * 8);
      }
      ppRVar4[uVar5] = pRVar2;
      if (0 < (long)__n) {
        memmove(ppRVar4,__src,__n);
      }
      if (__src != (pointer)0x0) {
        operator_delete(__src);
      }
      (this->_output).
      super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppRVar4;
      (this->_output).
      super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppRVar4 + __n + 8);
      (this->_output).
      super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppRVar4 + uVar6;
    }
    else {
      *ppRVar4 = pRVar2;
      pppRVar1 = &(this->_output).
                  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
    _clone((ImageManager *)&stack0xffffffffffffffa8,(__fn *)this,image,in_ECX,in_R8);
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
    ::emplace_back<PenguinV_Image::ImageTemplate<unsigned_char>>
              ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
                *)&this->_outputClone,(ImageTemplate<unsigned_char> *)&stack0xffffffffffffffa8);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)&stack0xffffffffffffffa8);
    image = (this->_outputClone).
            super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  return image;
}

Assistant:

PenguinV_Image::Image & operator ()( PenguinV_Image::Image & image )
        {
            if ( image.type() != _type ) {
                _output.push_back( new ReferenceOwner( image ) );
                _outputClone.push_back( _clone( image ) );
                return _outputClone.back();
            }
            else {
                return image;
            }
        }